

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

bool __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::operator==
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *o)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar2 = (long)this->_cursor - (long)this->_stack;
  if (lVar2 == (long)o->_cursor - (long)o->_stack) {
    lVar3 = lVar2 / 0x30 + 1;
    lVar2 = 0;
    do {
      lVar3 = lVar3 + -1;
      bVar4 = lVar3 == 0;
      if (bVar4) {
        return bVar4;
      }
      bVar1 = Kernel::operator!=((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                                 ((long)&(this->_stack->numeral)._num._val[0]._mp_alloc + lVar2),
                                 (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                                 ((long)&(o->_stack->numeral)._num._val[0]._mp_alloc + lVar2));
      lVar2 = lVar2 + 0x30;
    } while (!bVar1);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator==(const Stack& o) const
  {
    if(size()!=o.size()) {
      return false;
    }
    size_t sz = size();
    for(size_t i=0; i!=sz; ++i) {
      if((*this)[i]!=o[i]) {
	return false;
      }
    }
    return true;
  }